

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O3

Type * QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_library_settings>_>::
       instance(void)

{
  int iVar1;
  
  if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_library_settings>>::
      instance()::holder == '\0') {
    iVar1 = __cxa_guard_acquire(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_library_settings>>
                                 ::instance()::holder);
    if (iVar1 != 0) {
      QLibrarySettings::QLibrarySettings(&instance::holder.storage);
      QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_library_settings>::guard._q_value.
      super___atomic_base<signed_char>._M_i = (Type)(__atomic_base<signed_char>)0xff;
      __cxa_atexit(QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_library_settings>::~Holder
                   ,&instance::holder,&__dso_handle);
      __cxa_guard_release(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_library_settings>>
                           ::instance()::holder);
    }
  }
  return (Type *)&instance::holder;
}

Assistant:

static Type *instance() noexcept(Holder::ConstructionIsNoexcept)
    {
        static Holder holder;
        return holder.pointer();
    }